

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::read_file(string *path,string *out)

{
  ifstream fs;
  
  std::ifstream::ifstream(&fs,(string *)path,_S_bin);
  std::istream::seekg((long)&fs,_S_beg);
  std::istream::tellg();
  std::istream::seekg(&fs,0,0);
  std::__cxx11::string::resize((ulong)out);
  std::istream::read((char *)&fs,(long)(out->_M_dataplus)._M_p);
  std::ifstream::~ifstream(&fs);
  return;
}

Assistant:

inline void read_file(const std::string& path, std::string& out)
{
    std::ifstream fs(path, std::ios_base::binary);
    fs.seekg(0, std::ios_base::end);
    auto size = fs.tellg();
    fs.seekg(0);
    out.resize(static_cast<size_t>(size));
    fs.read(&out[0], size);
}